

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

ArrayInfo *
GGUFMeta::GKV_Base<GGUFMeta::ArrayInfo>::getter
          (ArrayInfo *__return_storage_ptr__,gguf_context *ctx,int k)

{
  gguf_type gVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  
  lVar4 = (long)k;
  gVar1 = gguf_get_arr_type(ctx,lVar4);
  __return_storage_ptr__->gt = gVar1;
  sVar2 = gguf_get_arr_n(ctx,lVar4);
  __return_storage_ptr__->length = sVar2;
  if (gVar1 == GGUF_TYPE_STRING) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = (void *)gguf_get_arr_data(ctx,lVar4);
  }
  __return_storage_ptr__->data = pvVar3;
  return __return_storage_ptr__;
}

Assistant:

static ArrayInfo getter(const gguf_context *ctx, const int k) {
            const enum gguf_type arr_type = gguf_get_arr_type(ctx, k);
            return ArrayInfo {
                arr_type,
                size_t(gguf_get_arr_n(ctx, k)),
                arr_type == GGUF_TYPE_STRING ? nullptr : gguf_get_arr_data(ctx, k),
            };
        }